

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void nite::print(char *c)

{
  allocator local_31;
  string local_30;
  char *local_10;
  char *c_local;
  
  local_10 = c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,c,&local_31);
  print(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void nite::print(const char *c){
		nite::print(String(c));
}